

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.h
# Opt level: O2

__sighandler_t __thiscall Condition::signal(Condition *this,int __sig,__sighandler_t __handler)

{
  int iVar1;
  undefined8 in_RAX;
  undefined8 extraout_RAX;
  
  iVar1 = this->waitingCount;
  if (iVar1 != 0) {
    this->waitingCount = iVar1 + -1;
    Semaphore::v(&this->w);
    in_RAX = extraout_RAX;
  }
  return (__sighandler_t)CONCAT71((int7)((ulong)in_RAX >> 8),iVar1 != 0);
}

Assistant:

bool signal() {
        if (waitingCount) {
            --waitingCount;
            w.v();
            return true;
        }//if
        else
            return false;
    }